

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall lzham::lzcompressor::compress_block(lzcompressor *this,void *pBuf,uint buf_len)

{
  lzdecision *plVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  lzdecision *plVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  uchar *puVar6;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  uint temp;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int *piVar16;
  ulong uVar17;
  void *pData_ptr;
  void *extraout_RDX;
  void *pData_ptr_00;
  void *extraout_RDX_00;
  uint uVar18;
  long lVar19;
  parse_thread_state *ppVar20;
  uint64 data;
  symbol_codec *this_00;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  search_accelerator *this_01;
  lzdecision lzdec;
  lzdecision lzdec_00;
  uint bytes_to_match;
  uint cur_dict_ofs;
  uint local_98;
  uint local_94;
  symbol_codec *local_90;
  ulong local_88;
  ulong local_80;
  state *local_78;
  parse_thread_state *local_70;
  ulong local_68;
  search_accelerator *local_60;
  uint local_54;
  state *local_50;
  sem_t *local_48;
  ulong local_40;
  state *local_38;
  
  if (-1 < this->m_src_size) {
    uVar17 = (ulong)buf_len;
    this->m_src_size = this->m_src_size + uVar17;
    this_01 = &this->m_accel;
    bVar11 = search_accelerator::add_bytes_begin(this_01,buf_len,(uint8 *)pBuf);
    if (bVar11) {
      uVar13 = adler32(pBuf,uVar17,this->m_src_adler32);
      this->m_src_adler32 = uVar13;
      uVar18 = (this->m_accel).m_max_dict_size - 1 & (this->m_accel).m_lookahead_pos;
      this->m_block_start_dict_ofs = uVar18;
      this_00 = &this->m_codec;
      local_98 = buf_len;
      local_94 = uVar18;
      bVar11 = symbol_codec::start_encoding(this_00,buf_len * 9 >> 3);
      if ((bVar11) &&
         ((((this->m_block_index != 0 || (bVar11 = send_configuration(this), bVar11)) &&
           (bVar11 = symbol_codec::encode_bits(this_00,1,2), bVar11)) &&
          (bVar11 = symbol_codec::encode_arith_init(this_00), bVar11)))) {
        local_78 = &this->m_state;
        (this->m_state).super_state_base.m_match_hist[3] = 1;
        (this->m_state).super_state_base.m_cur_state = 0;
        (this->m_state).super_state_base.m_match_hist[0] = 1;
        (this->m_state).super_state_base.m_match_hist[1] = 1;
        (this->m_state).super_state_base.m_match_hist[2] = 1;
        (this->m_state).super_state_base.m_cur_ofs = uVar18;
        (this->m_state).m_block_start_dict_ofs = uVar18;
        local_50 = &this->m_initial_state;
        state::operator=(local_50,local_78);
        local_54 = this->m_step;
        uVar13 = buf_len;
        local_90 = this_00;
        if (local_98 != 0) {
          local_48 = (sem_t *)&this->m_parse_jobs_complete;
          local_70 = this->m_parse_thread_state;
          local_38 = &this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state;
          local_68 = (ulong)buf_len;
          local_60 = this_01;
          local_40 = uVar17;
          do {
            uVar18 = (local_98 + 0xbff) / 0xc00;
            if (this->m_num_parse_threads < uVar18) {
              uVar18 = this->m_num_parse_threads;
            }
            if (((((this->m_params).m_lzham_compress_flags & 4) == 0) &&
                (this->m_use_task_pool == true)) &&
               (((this->m_accel).m_max_helper_threads != 0 &&
                (uVar18 = uVar18 + (int)(this->m_accel).m_num_completed_helper_threads, 7 < uVar18))
               )) {
              uVar18 = 8;
            }
            if (local_98 < 0x600) {
              uVar18 = 1;
            }
            local_88 = (ulong)uVar18;
            if (this->m_block_index == 0) {
              bVar11 = local_94 - this->m_block_start_dict_ofs < 0xc00;
              if (bVar11) {
                local_88 = 1;
              }
            }
            else {
              bVar11 = false;
            }
            iVar15 = (int)local_88;
            uVar18 = iVar15 * 0xc00;
            if (local_98 < (uint)(iVar15 * 0xc00)) {
              uVar18 = local_98;
            }
            pData_ptr = (void *)(ulong)uVar18;
            uVar23 = 0x600;
            if (uVar18 < 0x600) {
              uVar23 = uVar18;
            }
            if (!bVar11) {
              uVar23 = uVar18;
            }
            local_80 = local_88;
            if (iVar15 != 0) {
              lVar19 = local_88 * 0xb2b00;
              lVar24 = 0;
              uVar22 = local_94;
              uVar18 = uVar23;
              do {
                state::operator=((state *)((long)(local_38->super_state_base).m_match_hist +
                                          lVar24 + -8),local_78);
                *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                                m_approx_state.super_state_base.m_match_hist + lVar24 + -8) = uVar22
                ;
                if (lVar24 != 0) {
                  *(undefined4 *)
                   ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_approx_state.
                          super_state_base.m_match_hist + lVar24 + 0xc) = 1;
                  puVar2 = (undefined8 *)
                           ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                                  m_approx_state.super_state_base.m_match_hist + lVar24 + -4);
                  *puVar2 = 0x100000000;
                  puVar2[1] = 0x100000001;
                }
                (&this->m_parse_thread_state[0].super_raw_parse_thread_state.
                  m_issued_reset_state_partial)[lVar24] = lVar24 != 0;
                *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                                m_approx_state.super_state_base.m_match_hist + lVar24 + -0x10) =
                     uVar22;
                pData_ptr = extraout_RDX;
                uVar14 = uVar18;
                if ((ulong)(iVar15 - 1) * 0xb2b00 - lVar24 != 0) {
                  uVar14 = uVar23 / (uint)local_88;
                  pData_ptr = (void *)((ulong)uVar23 % (local_88 & 0xffffffff));
                }
                if (0xbff < uVar14) {
                  uVar14 = 0xc00;
                }
                *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                                m_approx_state.super_state_base.m_match_hist + lVar24 + -0xc) =
                     uVar14;
                uVar22 = uVar22 + uVar14;
                uVar18 = uVar18 - uVar14;
                lVar24 = lVar24 + 0xb2b00;
              } while (lVar19 - lVar24 != 0);
            }
            this_01 = local_60;
            uVar21 = local_68;
            ppVar20 = local_70;
            uVar17 = local_80;
            uVar18 = (uint)local_88;
            if ((uVar18 < 2) || (this->m_use_task_pool == false)) {
              this->m_parse_jobs_remaining = 0x7fffffff;
              buf_len = (uint)local_68;
              this_00 = local_90;
              if (uVar18 != 0) {
                data = 0;
                do {
                  parse_job_callback(this,data,pData_ptr);
                  data = data + 1;
                  pData_ptr = extraout_RDX_00;
                } while (uVar17 != data);
                goto LAB_0010dc7d;
              }
            }
            else {
              this->m_parse_jobs_remaining = local_80;
              bVar11 = task_pool::
                       queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
                                 ((this->m_params).m_pTask_pool,this,0x10f3cc,0,1,
                                  (void *)(ulong)(uVar18 - 1));
              this_01 = local_60;
              uVar21 = local_68;
              ppVar20 = local_70;
              if (!bVar11) {
                return false;
              }
              parse_job_callback(this,0,pData_ptr_00);
              iVar15 = sem_wait(local_48);
              if ((iVar15 != 0) && (piVar16 = __errno_location(), *piVar16 != 0x6e)) {
                lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                           ,0x52);
              }
LAB_0010dc7d:
              buf_len = (uint)uVar21;
              this_00 = local_90;
              if ((uint)local_88 != 0) {
                uVar17 = 0;
                do {
                  if (ppVar20[uVar17].super_raw_parse_thread_state.m_failed != false) {
                    return false;
                  }
                  local_88 = uVar17;
                  if (ppVar20[uVar17].super_raw_parse_thread_state.m_issued_reset_state_partial ==
                      true) {
                    bVar11 = state::encode_reset_state_partial(local_78,this_00,this_01);
                    if (!bVar11) {
                      return false;
                    }
                    this->m_step = this->m_step + 1;
                  }
                  uVar13 = ppVar20[uVar17].super_raw_parse_thread_state.m_best_decisions.m_size;
                  if (uVar13 != 0) {
                    uVar23 = uVar13 - 1;
                    bVar11 = ppVar20[uVar17].super_raw_parse_thread_state.m_emit_decisions_backwards
                    ;
                    uVar18 = uVar23;
                    if (bVar11 == false) {
                      uVar18 = (uint)bVar11;
                    }
                    uVar21 = (ulong)uVar18;
                    uVar18 = uVar23;
                    if (bVar11 != false) {
                      uVar18 = 0;
                    }
                    plVar5 = ppVar20[uVar17].super_raw_parse_thread_state.m_best_decisions.m_p;
                    plVar1 = plVar5 + uVar21;
                    uVar3 = plVar1->m_pos;
                    uVar7 = plVar1->m_len;
                    lzdec.m_len = uVar7;
                    lzdec.m_pos = uVar3;
                    lzdec.m_dist = plVar5[uVar21].m_dist;
                    bVar12 = code_decision(this,lzdec,&local_94,&local_98);
                    if (!bVar12) {
                      return false;
                    }
                    if (uVar23 != 0) {
                      do {
                        uVar23 = (int)uVar21 + (-(uint)bVar11 | 1);
                        uVar21 = (ulong)uVar23;
                        plVar5 = ppVar20[uVar17].super_raw_parse_thread_state.m_best_decisions.m_p;
                        plVar1 = plVar5 + uVar21;
                        uVar4 = plVar1->m_pos;
                        uVar8 = plVar1->m_len;
                        lzdec_00.m_len = uVar8;
                        lzdec_00.m_pos = uVar4;
                        lzdec_00.m_dist = plVar5[uVar21].m_dist;
                        bVar12 = code_decision(this,lzdec_00,&local_94,&local_98);
                        if (!bVar12) {
                          return false;
                        }
                      } while (uVar18 != uVar23);
                    }
                    ppVar20 = local_70;
                    this_00 = local_90;
                    uVar21 = local_68;
                    if (bVar12 == false) {
                      return false;
                    }
                  }
                  buf_len = (uint)uVar21;
                  uVar17 = local_88 + 1;
                  this_01 = local_60;
                } while (uVar17 != local_80);
              }
            }
            uVar13 = (uint)local_40;
          } while (local_98 != 0);
        }
        search_accelerator::add_bytes_end(this_01);
        bVar11 = state::encode_eob(local_78,this_00,this_01);
        if ((bVar11) && (bVar11 = symbol_codec::stop_encoding(this_00,true), bVar11)) {
          if (buf_len <= (this->m_codec).m_output_buf.m_size) {
            state::operator=(local_78,local_50);
            this->m_step = local_54;
            symbol_codec::clear(this_00);
            bVar11 = symbol_codec::start_encoding(this_00,buf_len + 0x10);
            if (!bVar11) {
              return false;
            }
            if ((this->m_block_index == 0) && (bVar11 = send_configuration(this), !bVar11)) {
              return false;
            }
            bVar11 = symbol_codec::encode_bits(this_00,2,2);
            if (!bVar11) {
              return false;
            }
            bVar11 = symbol_codec::encode_bits(this_00,buf_len - 1,0x18);
            if (!bVar11) {
              return false;
            }
            bVar11 = symbol_codec::encode_align_to_byte(this_00);
            if (!bVar11) {
              return false;
            }
            if (buf_len != 0) {
              uVar18 = this->m_block_start_dict_ofs;
              puVar6 = (this->m_accel).m_dict.m_p;
              lVar19 = 0;
              do {
                bVar11 = symbol_codec::encode_bits(local_90,(uint)puVar6[lVar19 + (ulong)uVar18],8);
                if (!bVar11) {
                  return false;
                }
                lVar19 = lVar19 + 1;
              } while (uVar13 != (uint)lVar19);
            }
            bVar11 = symbol_codec::stop_encoding(local_90,true);
            if (!bVar11) {
              return false;
            }
          }
          if ((this->m_comp_buf).m_size == 0) {
            puVar6 = (this->m_comp_buf).m_p;
            uVar9 = (this->m_codec).m_output_buf.m_size;
            uVar10 = (this->m_codec).m_output_buf.m_capacity;
            uVar13 = (this->m_comp_buf).m_capacity;
            (this->m_comp_buf).m_p = (this->m_codec).m_output_buf.m_p;
            (this->m_comp_buf).m_size = uVar9;
            (this->m_comp_buf).m_capacity = uVar10;
            (this->m_codec).m_output_buf.m_p = puVar6;
            (this->m_codec).m_output_buf.m_size = 0;
            (this->m_codec).m_output_buf.m_capacity = uVar13;
          }
          else {
            bVar11 = vector<unsigned_char>::append(&this->m_comp_buf,&(this->m_codec).m_output_buf);
            if (!bVar11) {
              return false;
            }
          }
          this->m_block_index = this->m_block_index + 1;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool lzcompressor::compress_block(const void* pBuf, uint buf_len)
   {
      scoped_perf_section compress_block_timer(cVarArgs, "****** compress_block %u", m_block_index);

      LZHAM_ASSERT(pBuf);
      LZHAM_ASSERT(buf_len <= m_params.m_block_size);

      LZHAM_ASSERT(m_src_size >= 0);
      if (m_src_size < 0)
         return false;

      m_src_size += buf_len;

      if (!m_accel.add_bytes_begin(buf_len, static_cast<const uint8*>(pBuf)))
         return false;

      m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);

      m_block_start_dict_ofs = m_accel.get_lookahead_pos() & (m_accel.get_max_dict_size() - 1);

      uint cur_dict_ofs = m_block_start_dict_ofs;

      uint bytes_to_match = buf_len;

      if (!m_codec.start_encoding((buf_len * 9) / 8))
         return false;

      if (!m_block_index)
      {
         if (!send_configuration())
            return false;
      }

#ifdef LZHAM_LZDEBUG
      m_codec.encode_bits(166, 12);
#endif

      if (!m_codec.encode_bits(cCompBlock, cBlockHeaderBits))
         return false;

      if (!m_codec.encode_arith_init())
         return false;

      m_state.start_of_block(m_accel, cur_dict_ofs, m_block_index);

      m_initial_state = m_state;

      coding_stats initial_stats(m_stats);

      uint initial_step = m_step;

#if 0
#ifdef LZHAM_LZVERIFY
      // TODO: This no longer works.
      lzham::vector<lzdecision> lzdecisions0;
      if (!lzdecisions0.try_reserve(64))
         return false;

      for (uint i = 0; i < bytes_to_match; i++)
      {
         uint cur_dict_ofs = m_block_start_dict_ofs + i;
         int largest_match_index = enumerate_lz_decisions(cur_dict_ofs, m_state, lzdecisions0, 1);
         if (largest_match_index < 0)
            return false;

         bit_cost_t largest_match_cost = lzdecisions0[largest_match_index].m_cost;
         uint largest_match_len = lzdecisions0[largest_match_index].get_len();

         for (uint j = 0; j < lzdecisions0.size(); j++)
         {
            const lzdecision& lzdec = lzdecisions0[j];

            if (lzdec.is_match())
            {
               uint match_dist = lzdec.get_match_dist(m_state);

               for (uint k = 0; k < lzdec.get_len(); k++)
               {
                  LZHAM_VERIFY(m_accel[cur_dict_ofs+k] == m_accel[(cur_dict_ofs+k - match_dist) & (m_accel.get_max_dict_size() - 1)]);
               }
            }
         }
      }
#endif
#endif

      while (bytes_to_match)
      {
         uint num_parse_jobs = LZHAM_MIN(m_num_parse_threads, (bytes_to_match + cMaxParseGraphNodes - 1) / cMaxParseGraphNodes);
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING) == 0)
         {
            if (m_use_task_pool && m_accel.get_max_helper_threads())
            {
               // Increase the number of parser threads as the match finder finishes up.
               num_parse_jobs += m_accel.get_num_completed_helper_threads();
               num_parse_jobs = LZHAM_MIN(num_parse_jobs, cMaxParseThreads);
            }
         }
         if (bytes_to_match < 1536)
            num_parse_jobs = 1;

         // Reduce block size near the beginning of the file so statistical models get going a bit faster.
         bool force_small_block = false;
         if ( (!m_block_index) && ((cur_dict_ofs - m_block_start_dict_ofs) < cMaxParseGraphNodes) )
         {
            num_parse_jobs = 1;
            force_small_block = true;
         }

         uint parse_thread_start_ofs = cur_dict_ofs;
         uint parse_thread_total_size = LZHAM_MIN(bytes_to_match, cMaxParseGraphNodes * num_parse_jobs);
         if (force_small_block)
         {
            parse_thread_total_size = LZHAM_MIN(parse_thread_total_size, 1536);
         }

         uint parse_thread_remaining = parse_thread_total_size;
         for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
         {
            parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

            parse_thread.m_approx_state = m_state;
            parse_thread.m_approx_state.m_cur_ofs = parse_thread_start_ofs;

            if (parse_thread_index > 0)
            {
               parse_thread.m_approx_state.reset_state_partial();
               parse_thread.m_issued_reset_state_partial = true;
            }
            else
            {
               parse_thread.m_issued_reset_state_partial = false;
            }

            parse_thread.m_start_ofs = parse_thread_start_ofs;
            if (parse_thread_index == (num_parse_jobs - 1))
               parse_thread.m_bytes_to_match = parse_thread_remaining;
            else
               parse_thread.m_bytes_to_match = parse_thread_total_size / num_parse_jobs;

            parse_thread.m_bytes_to_match = LZHAM_MIN(parse_thread.m_bytes_to_match, cMaxParseGraphNodes);
            LZHAM_ASSERT(parse_thread.m_bytes_to_match > 0);

            parse_thread_start_ofs += parse_thread.m_bytes_to_match;
            parse_thread_remaining -= parse_thread.m_bytes_to_match;
         }

         {
            scoped_perf_section parse_timer("parsing");

            if ((m_use_task_pool) && (num_parse_jobs > 1))
            {
               m_parse_jobs_remaining = num_parse_jobs;

               {
                  scoped_perf_section queue_task_timer("queing parse tasks");

                  if (!m_params.m_pTask_pool->queue_multiple_object_tasks(this, &lzcompressor::parse_job_callback, 1, num_parse_jobs - 1))
                     return false;
               }

               parse_job_callback(0, NULL);

               {
                  scoped_perf_section wait_timer("waiting for jobs");

                  m_parse_jobs_complete.wait();
               }
            }
            else
            {
               m_parse_jobs_remaining = INT_MAX;
               for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
               {
                  parse_job_callback(parse_thread_index, NULL);
               }
            }
         }

         {
            scoped_perf_section coding_timer("coding");

            for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
            {
               parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];
               if (parse_thread.m_failed)
                  return false;

               const lzham::vector<lzdecision> &best_decisions = parse_thread.m_best_decisions;

               if (parse_thread.m_issued_reset_state_partial)
               {
                  if (!m_state.encode_reset_state_partial(m_codec, m_accel))
                     return false;
                  m_step++;
               }

               if (best_decisions.size())
               {
                  int i = 0;
                  int end_dec_index = static_cast<int>(best_decisions.size()) - 1;
                  int dec_step = 1;
                  if (parse_thread.m_emit_decisions_backwards)
                  {

                     i = static_cast<int>(best_decisions.size()) - 1;
                     end_dec_index = 0;

                     dec_step = -1;
                  }

                  LZHAM_ASSERT(best_decisions.back().m_pos == (int)parse_thread.m_start_ofs);

                  // Loop rearranged to avoid bad x64 codegen problem with MSVC2008.
                  for ( ; ; )
                  {
                     LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                     LZHAM_ASSERT(i >= 0);
                     LZHAM_ASSERT(i < (int)best_decisions.size());

#if LZHAM_UPDATE_STATS
                     bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                     m_stats.update(best_decisions[i], m_state, m_accel, cost);
#endif

                     if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                        return false;
                     if (i == end_dec_index)
                        break;
                     i += dec_step;
                  }
               }

               LZHAM_ASSERT(cur_dict_ofs == parse_thread.m_start_ofs + parse_thread.m_bytes_to_match);

            } // parse_thread_index

         }
      }

      {
         scoped_perf_section add_bytes_timer("add_bytes_end");
         m_accel.add_bytes_end();
      }

      if (!m_state.encode_eob(m_codec, m_accel))
         return false;

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(366, 12)) return false;
#endif

      {
         scoped_perf_section stop_encoding_timer("stop_encoding");
         if (!m_codec.stop_encoding(true)) return false;
      }

      uint compressed_size = m_codec.get_encoding_buf().size();
      compressed_size;

#if defined(LZHAM_DISABLE_RAW_BLOCKS) || defined(LZHAM_LZDEBUG)
      if (0)
#else
      if (compressed_size >= buf_len)
#endif
      {
         m_state = m_initial_state;
         m_step = initial_step;
         //m_stats = initial_stats;

         m_codec.clear();

         if (!m_codec.start_encoding(buf_len + 16)) return false;

         if (!m_block_index)
         {
            if (!send_configuration())
               return false;
         }

#ifdef LZHAM_LZDEBUG
         if (!m_codec.encode_bits(166, 12)) return false;
#endif

         if (!m_codec.encode_bits(cRawBlock, cBlockHeaderBits)) return false;

         LZHAM_ASSERT(buf_len <= 0x1000000);
         if (!m_codec.encode_bits(buf_len - 1, 24)) return false;
         if (!m_codec.encode_align_to_byte()) return false;

         const uint8* pSrc = m_accel.get_ptr(m_block_start_dict_ofs);

         for (uint i = 0; i < buf_len; i++)
         {
            if (!m_codec.encode_bits(*pSrc++, 8)) return false;
         }

         if (!m_codec.stop_encoding(true)) return false;
      }

      {
         scoped_perf_section append_timer("append");

         if (m_comp_buf.empty())
         {
            m_comp_buf.swap(m_codec.get_encoding_buf());
         }
         else
         {
            if (!m_comp_buf.append(m_codec.get_encoding_buf()))
               return false;
         }
      }
#if LZHAM_UPDATE_STATS
      LZHAM_VERIFY(m_stats.m_total_bytes == m_src_size);
#endif

      m_block_index++;

      return true;
   }